

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

Var __thiscall Minisat::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  vec<char> *pvVar1;
  int iVar2;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  long lVar3;
  long lVar4;
  char cVar5;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int iVar6;
  int size;
  float fVar7;
  double dVar8;
  VarData local_48;
  long local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,dvar);
  local_38 = (undefined4)CONCAT71(in_register_00000031,sign);
  iVar2 = (this->vardata).sz;
  iVar6 = iVar2 * 2 + 1;
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches_bin).occs,iVar6);
  pvVar1 = &(this->watches_bin).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,iVar6,(char *)&local_48);
  size = iVar2 * 2 + 2;
  local_40 = (long)iVar2;
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches_bin).occs,size);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches).occs,iVar6);
  pvVar1 = &(this->watches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,iVar6,(char *)&local_48);
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches).occs,size);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  local_48.reason._0_1_ = 2;
  vec<Minisat::lbool>::push(&this->assigns,(lbool *)&local_48);
  local_48.reason = 0xffffffff;
  local_48.level = 0;
  vec<Minisat::Solver::VarData>::push(&this->vardata,&local_48);
  vec<unsigned_int>::push(&this->oldreasons,&CRef_Undef);
  local_48.reason = 0;
  local_48.level = 0;
  vec<double>::push(&this->activity_CHB,(double *)&local_48);
  lVar3 = local_40;
  iVar2 = this->init_act;
  iVar6 = (int)local_40;
  if (iVar2 == 3) {
    fVar7 = (float)iVar6;
  }
  else if (iVar2 == 2) {
    fVar7 = (float)(int)(1000 / (long)iVar6);
  }
  else {
    fVar7 = 0.0;
    if (iVar2 == 1) {
      dVar8 = this->random_seed * 1389796.0;
      dVar8 = dVar8 - (double)(int)(dVar8 / 2147483647.0) * 2147483647.0;
      this->random_seed = dVar8;
      fVar7 = (float)((dVar8 / 2147483647.0) * 1e-05);
    }
  }
  local_48 = (VarData)(double)fVar7;
  vec<double>::push(&this->activity_VSIDS,(double *)&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  vec<double>::push(&this->activity_distance,(double *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->picked,&local_48.reason);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->conflicted,&local_48.reason);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->almost_conflicted,&local_48.reason);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->canceled,&local_48.reason);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::push(&this->seen,(char *)&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  vec<unsigned_long>::push(&this->seen2,(unsigned_long *)&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  vec<unsigned_long>::push(&this->seen2,(unsigned_long *)&local_48);
  local_48.reason._0_1_ = (byte)local_38 ^ this->invert_pol;
  vec<char>::push(&this->polarity,(char *)&local_48);
  pvVar1 = &this->decision;
  vec<char>::push(pvVar1);
  vec<Minisat::Lit>::capacity(&this->trail,iVar6 + 1);
  vec<Minisat::Lit>::capacity(&this->old_trail,iVar6 + 1);
  local_48.reason = 0;
  local_48.level = 0;
  vec<double>::push(&this->var_iLevel,(double *)&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  vec<double>::push(&this->var_iLevel_tmp,(double *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<int>::push(&this->pathCs,(int *)&local_48);
  cVar5 = (char)local_34;
  if (cVar5 == '\0') {
LAB_00114c80:
    lVar4 = -1;
    if (pvVar1->data[lVar3] != '\0') goto LAB_00114c98;
  }
  else {
    if (pvVar1->data[lVar3] != '\0') {
      if (cVar5 != '\0') {
        pvVar1->data[lVar3] = cVar5;
        goto LAB_00114caa;
      }
      goto LAB_00114c80;
    }
    lVar4 = 1;
LAB_00114c98:
    this->dec_vars = this->dec_vars + lVar4;
  }
  pvVar1->data[lVar3] = cVar5;
  if (cVar5 == '\0') {
    return iVar6;
  }
LAB_00114caa:
  this_00 = this->order_heap;
  if (((this_00->indices).sz <= iVar6) || ((this_00->indices).data[lVar3] < 0)) {
    Heap<Minisat::Solver::VarOrderLt>::insert(this_00,iVar6);
  }
  return iVar6;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar)
{
    int v = nVars();
    watches_bin.init(mkLit(v, false));
    watches_bin.init(mkLit(v, true));
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    assigns.push(l_Undef);
    vardata.push(mkVarData(CRef_Undef, 0));
    oldreasons.push(CRef_Undef);
    activity_CHB.push(0);
    float new_activity = 0;
    if (init_act == 1)
        new_activity = drand(random_seed) * 0.00001;
    else if (init_act == 2)
        new_activity = 1000 / v;
    else if (init_act == 3)
        new_activity = v;
    activity_VSIDS.push(new_activity);
    activity_distance.push(0);

    picked.push(0);
    conflicted.push(0);
    almost_conflicted.push(0);
#ifdef ANTI_EXPLORATION
    canceled.push(0);
#endif

    seen.push(0);
    seen2.push(0);
    seen2.push(0);
    polarity.push(invert_pol ? !sign : sign);
    decision.push();
    trail.capacity(v + 1);
    old_trail.capacity(v + 1);

    var_iLevel.push(0);
    var_iLevel_tmp.push(0);
    pathCs.push(0);

    // TODO: make sure to add new data structures also to reserveVars below!

    setDecisionVar(v, dvar);
    return v;
}